

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::UploadTexCubeCase::iterate(UploadTexCubeCase *this)

{
  RenderContext *context;
  code *pcVar1;
  TestContext *testCtx;
  pointer data;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  GLenum err;
  undefined4 uVar5;
  undefined4 extraout_var;
  ProgramSources *pPVar6;
  undefined4 extraout_var_00;
  TestError *this_00;
  char *description;
  int faceNdx_1;
  long lVar7;
  int y;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *pvVar8;
  int faceNdx;
  int x;
  long lVar9;
  allocator<char> local_561;
  UploadTexCubeCase *local_560;
  LodPrecision local_554;
  undefined1 local_548 [8];
  _Alloc_hider _Stack_540;
  undefined1 local_538 [24];
  BVec4 local_520;
  long local_510;
  float local_508 [8];
  deUint8 indices [6];
  undefined2 uStack_4e2;
  vector<float,_std::allocator<float>_> texCoord;
  Texture depthStencilTex;
  Renderbuffer colorBuf;
  Framebuffer fbo;
  float positions [8];
  TextureLevel result;
  VertexArrayBinding vertexArrays [2];
  ShaderProgram program;
  ConstPixelBufferAccess *pCStack_1b8;
  TextureCube texData;
  Functions *gl;
  
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_560 = this;
  iVar3 = (*context->_vptr_RenderContext[3])(context);
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper(&fbo,context);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper(&colorBuf,context);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper(&depthStencilTex,context);
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)glu::mapGLInternalFormat(local_560->m_format);
  tcu::TextureCube::TextureCube(&texData,(TextureFormat *)&program,0x40);
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x300000008;
  tcu::TextureLevel::TextureLevel(&result,(TextureFormat *)&program,0x80,0x80,1);
  checkDepthStencilFormatSupport((local_560->super_TestCase).m_context,local_560->m_format);
  iVar3 = 0;
  pvVar8 = texData.m_access;
  for (lVar9 = 0; lVar9 != 6; lVar9 = lVar9 + 1) {
    tcu::TextureCube::allocLevel(&texData,(CubeFace)lVar9,0);
    tcu::clearStencil((pvVar8->
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      )._M_impl.super__Vector_impl_data._M_start,iVar3);
    iVar3 = iVar3 + 0x2a;
    pvVar8 = pvVar8 + 1;
  }
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xbfa66666bfc00000;
  vertexArrays[0].binding.type = 0x3fa66666;
  vertexArrays[0].binding._4_4_ = 0x3fb33333;
  glu::TextureTestUtil::computeQuadTexCoordCube
            (&texCoord,CUBEFACE_NEGATIVE_X,(Vec2 *)&program,(Vec2 *)vertexArrays);
  (*gl->bindTexture)(0x8513,depthStencilTex.super_ObjectWrapper.m_object);
  (*gl->texStorage2D)(0x8513,1,local_560->m_format,0x40,0x40);
  lVar9 = 0;
  pvVar8 = texData.m_access;
  while( true ) {
    if (lVar9 == 6) break;
    dVar4 = glu::getGLCubeFace((CubeFace)lVar9);
    glu::texSubImage2D(context,dVar4,0,0,0,
                       &((pvVar8->
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         )._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess);
    lVar9 = lVar9 + 1;
    pvVar8 = pvVar8 + 1;
  }
  err = (*gl->getError)();
  glu::checkError(err,"Uploading texture data failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                  ,0x2b9);
  (*gl->bindRenderbuffer)(0x8d41,colorBuf.super_ObjectWrapper.m_object);
  (*gl->renderbufferStorage)(0x8d41,0x8058,0x80,0x80);
  (*gl->bindFramebuffer)(0x8d40,fbo.super_ObjectWrapper.m_object);
  (*gl->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,colorBuf.super_ObjectWrapper.m_object);
  checkFramebufferStatus(gl);
  data = texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start;
  memset(vertexArrays,0,0xac);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)indices,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec3 a_texCoord;\nout highp vec3 v_texCoord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_texCoord = a_texCoord;\n}\n"
             ,(allocator<char> *)&local_554);
  glu::VertexSource::VertexSource((VertexSource *)positions,(string *)indices);
  pPVar6 = glu::ProgramSources::operator<<((ProgramSources *)vertexArrays,(ShaderSource *)positions)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_508,
             "#version 300 es\nuniform highp usamplerCube u_sampler;\nin highp vec3 v_texCoord;\nlayout(location = 0) out highp vec4 o_color;\nvoid main (void)\n{\n\to_color.x = float(texture(u_sampler, v_texCoord).x) / 255.0;\n\to_color.yzw = vec3(0.0, 0.0, 1.0);\n}\n"
             ,&local_561);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_548,(string *)local_508);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)local_548);
  glu::ShaderProgram::ShaderProgram(&program,context,pPVar6);
  std::__cxx11::string::~string((string *)&_Stack_540);
  std::__cxx11::string::~string((string *)local_508);
  std::__cxx11::string::~string((string *)(positions + 2));
  std::__cxx11::string::~string((string *)indices);
  glu::ProgramSources::~ProgramSources((ProgramSources *)vertexArrays);
  positions[4] = 1.0;
  positions[5] = -1.0;
  positions[6] = 1.0;
  positions[7] = 1.0;
  positions[0] = -1.0;
  positions[1] = -1.0;
  positions[2] = -1.0;
  positions[3] = 1.0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_548,"a_position",(allocator<char> *)local_508);
  glu::va::Float(vertexArrays,(string *)local_548,2,4,0,positions);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)indices,"a_texCoord",(allocator<char> *)&local_554);
  glu::va::Float(vertexArrays + 1,(string *)indices,3,4,0,data);
  std::__cxx11::string::~string((string *)indices);
  std::__cxx11::string::~string((string *)local_548);
  indices[0] = '\0';
  indices[1] = '\0';
  indices[2] = '\0';
  indices[3] = '\0';
  indices[4] = '\x01';
  indices[5] = '\x03';
  indices[0] = '\0';
  indices[1] = '\x01';
  indices[2] = '\x02';
  indices[3] = '\x02';
  iVar3 = (*context->_vptr_RenderContext[3])(context);
  lVar9 = CONCAT44(extraout_var_00,iVar3);
  if (program.m_program.m_info.linkOk == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_548,"Compile failed",(allocator<char> *)local_508);
    tcu::TestError::TestError(this_00,(string *)local_548);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar9 + 8))(0x84c0);
  (**(code **)(lVar9 + 0xb8))(0x8513,depthStencilTex.super_ObjectWrapper.m_object);
  (**(code **)(lVar9 + 0x1360))(0x8513,0x2801,0x2600);
  (**(code **)(lVar9 + 0x1360))(0x8513,0x2800,0x2600);
  (**(code **)(lVar9 + 0x1360))(0x8513,0x90ea,0x1901);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"Texture state setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                  ,0x179);
  (**(code **)(lVar9 + 0x1680))(program.m_program.m_program);
  pcVar1 = *(code **)(lVar9 + 0x14f0);
  uVar5 = (**(code **)(lVar9 + 0xb48))(program.m_program.m_program,"u_sampler");
  (*pcVar1)(uVar5,0);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"Program setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                  ,0x17d);
  (**(code **)(lVar9 + 0x1a00))(0,0,0x80,0x80);
  local_548 = (undefined1  [8])0x600000000;
  _Stack_540._M_p = (pointer)((ulong)_Stack_540._M_p._4_4_ << 0x20);
  local_538._0_8_ = (string *)indices;
  glu::draw(context,program.m_program.m_program,2,vertexArrays,(PrimitiveList *)local_548,
            (DrawUtilCallback *)0x0);
  lVar9 = 0x58;
  do {
    std::__cxx11::string::~string((string *)((long)&vertexArrays[0].binding.type + lVar9));
    lVar9 = lVar9 + -0x50;
  } while (lVar9 != -0x48);
  glu::ShaderProgram::~ShaderProgram(&program);
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&program,&result);
  glu::readPixels(context,0,0,(PixelBufferAccess *)&program);
  vertexArrays[0].binding.type = TYPE_LOCATION;
  vertexArrays[0].binding._4_4_ = 3;
  tcu::TextureCube::TextureCube((TextureCube *)&program,(TextureFormat *)vertexArrays,0x40);
  positions[0] = 0.0;
  positions[1] = 0.0;
  positions[2] = 0.0;
  positions[3] = 0.0;
  positions[4] = 0.0;
  positions[5] = 0.0;
  positions[6] = (float)CONCAT31(positions[6]._1_3_,1);
  positions[7] = 0.0;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)vertexArrays,TEXTURETYPE_CUBE,(Sampler *)positions,LODMODE_EXACT);
  tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_548);
  local_554.rule = RULE_OPENGL;
  local_520.m_data[0] = true;
  local_520.m_data[1] = true;
  local_520.m_data[2] = true;
  local_520.m_data[3] = true;
  indices[0] = '\b';
  indices[1] = '\0';
  indices[2] = '\0';
  indices[3] = '\0';
  stack0xfffffffffffffb1c = UNORM_SHORT_565;
  tcu::computeFixedPointThreshold((tcu *)positions,(IVec4 *)indices);
  local_538._8_4_ = positions[0];
  local_538._12_4_ = positions[1];
  local_538._16_4_ = positions[2];
  local_538._20_4_ = positions[3];
  local_548 = (undefined1  [8])0x1600000016;
  _Stack_540._M_p = (pointer)0x500000016;
  local_538._0_8_ = 5;
  local_554.derivateBits = 0x10;
  local_554.lodBits = 7;
  for (lVar9 = 0;
      lVar9 < (int)(((long)texData.m_access[0].
                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)texData.m_access[0].
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x28); lVar9 = lVar9 + 1) {
    local_510 = lVar9 * 0x28;
    for (lVar7 = 0; lVar7 != 6; lVar7 = lVar7 + 1) {
      if (texData.m_data[lVar7].
          super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar9].m_cap != 0) {
        tcu::TextureCube::allocLevel((TextureCube *)&program,(CubeFace)lVar7,(int)lVar9);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)positions,
                   (ConstPixelBufferAccess *)
                   ((long)((texData.m_access[lVar7].
                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess
                          ).m_size.m_data + local_510 + -8));
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)indices,
                   (ConstPixelBufferAccess *)
                   ((&program.m_program.m_info.infoLog._M_dataplus)[lVar7 * 3]._M_p + local_510));
        iVar3 = texData.m_size;
        for (y = 0; y < iVar3; y = y + 1) {
          for (x = 0; x < iVar3; x = x + 1) {
            iVar3 = tcu::ConstPixelBufferAccess::getPixStencil
                              ((ConstPixelBufferAccess *)positions,x,y,0);
            local_508[0] = (float)iVar3 / 255.0;
            local_508[1] = 0.0;
            local_508[2] = 0.0;
            local_508[3] = 1.0;
            tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)indices,(Vec4 *)local_508,x,y,0);
            iVar3 = texData.m_size;
          }
        }
      }
    }
  }
  testCtx = (local_560->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)indices,&result);
  positions[6] = SUB84(pCStack_1b8,0);
  positions[7] = (float)((ulong)pCStack_1b8 >> 0x20);
  local_508[0] = 1.12104e-44;
  local_508[1] = 1.12104e-44;
  local_508[2] = 1.12104e-44;
  local_508[3] = 1.12104e-44;
  bVar2 = glu::TextureTestUtil::verifyTextureResult
                    (testCtx,(ConstPixelBufferAccess *)indices,(TextureCubeView *)positions,
                     texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,(ReferenceParams *)vertexArrays,
                     (LookupPrecision *)local_548,&local_554,(PixelFormat *)local_508);
  description = "Image comparison failed";
  if (bVar2) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((local_560->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar2,
             description);
  tcu::TextureCube::~TextureCube((TextureCube *)&program);
  tcu::TextureLevel::~TextureLevel(&result);
  tcu::TextureCube::~TextureCube(&texData);
  glu::ObjectWrapper::~ObjectWrapper(&depthStencilTex.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&colorBuf.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&fbo.super_ObjectWrapper);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&	renderCtx			= m_context.getRenderContext();
		const glw::Functions&		gl					= renderCtx.getFunctions();
		const int					size				= 64;
		const int					renderWidth			= 128;
		const int					renderHeight		= 128;
		vector<float>				texCoord;
		glu::Framebuffer			fbo					(renderCtx);
		glu::Renderbuffer			colorBuf			(renderCtx);
		glu::Texture				depthStencilTex		(renderCtx);
		tcu::TextureCube			texData				(glu::mapGLInternalFormat(m_format), size);
		tcu::TextureLevel			result				(TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8), renderWidth, renderHeight);

		checkDepthStencilFormatSupport(m_context, m_format);

		for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
		{
			const tcu::CubeFace		face		= tcu::CubeFace(faceNdx);
			const int				stencilVal	= 42*faceNdx;

			texData.allocLevel(face, 0);
			tcu::clearStencil(texData.getLevelFace(0, face), stencilVal);
		}

		glu::TextureTestUtil::computeQuadTexCoordCube(texCoord, tcu::CUBEFACE_NEGATIVE_X, Vec2(-1.5f, -1.3f), Vec2(1.3f, 1.4f));

		gl.bindTexture(GL_TEXTURE_CUBE_MAP, *depthStencilTex);
		gl.texStorage2D(GL_TEXTURE_CUBE_MAP, 1, m_format, size, size);

		for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
			glu::texSubImage2D(renderCtx, glu::getGLCubeFace(tcu::CubeFace(faceNdx)), 0, 0, 0, texData.getLevelFace(0, tcu::CubeFace(faceNdx)));

		GLU_EXPECT_NO_ERROR(gl.getError(), "Uploading texture data failed");

		gl.bindRenderbuffer(GL_RENDERBUFFER, *colorBuf);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, renderWidth, renderHeight);

		gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *colorBuf);
		checkFramebufferStatus(gl);

		blitStencilToColorCube(renderCtx, *depthStencilTex, &texCoord[0], renderWidth, renderHeight);
		glu::readPixels(renderCtx, 0, 0, result);

		{
			using namespace glu::TextureTestUtil;

			tcu::TextureCube		redTex			(TextureFormat(TextureFormat::R, TextureFormat::UNORM_INT8), size);
			const ReferenceParams	sampleParams	(TEXTURETYPE_CUBE, tcu::Sampler(tcu::Sampler::CLAMP_TO_EDGE,
																					tcu::Sampler::CLAMP_TO_EDGE,
																					tcu::Sampler::CLAMP_TO_EDGE,
																					tcu::Sampler::NEAREST,
																					tcu::Sampler::NEAREST));
			tcu::LookupPrecision	lookupPrec;
			tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_OPENGL);
			bool					compareOk;

			lookupPrec.colorMask		= tcu::BVec4(true, true, true, true);
			lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(IVec4(8, 8, 8, 8));
			lookupPrec.coordBits		= tcu::IVec3(22, 22, 22);
			lookupPrec.uvwBits			= tcu::IVec3(5, 5, 0);
			lodPrec.lodBits				= 7;
			lodPrec.derivateBits		= 16;

			stencilToUnorm8(texData, redTex);

			compareOk = verifyTextureResult(m_testCtx, result, redTex, &texCoord[0], sampleParams, lookupPrec, lodPrec, tcu::PixelFormat(8, 8, 8, 8));

			m_testCtx.setTestResult(compareOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL,
									compareOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}